

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

bool anon_unknown.dwarf_5292d::lexico_compare_3d(double *x,double *y)

{
  double *y_local;
  double *x_local;
  
  if (*y <= *x) {
    if (*x < *y || *x == *y) {
      if (y[1] <= x[1]) {
        if (x[1] < y[1] || x[1] == y[1]) {
          x_local._7_1_ = x[2] < y[2];
        }
        else {
          x_local._7_1_ = false;
        }
      }
      else {
        x_local._7_1_ = true;
      }
    }
    else {
      x_local._7_1_ = false;
    }
  }
  else {
    x_local._7_1_ = true;
  }
  return x_local._7_1_;
}

Assistant:

bool lexico_compare_3d(const double* x, const double* y) {
	if(x[0] < y[0]) {
	    return true;
	}
	if(x[0] > y[0]) {
	    return false;
	}
	if(x[1] < y[1]) {
	    return true;
	}
	if(x[1] > y[1]) {
	    return false;
	}
	return x[2] < y[2];
    }